

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_recurse(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  bson_iter_t child;
  bson_t cb;
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_300 [128];
  undefined1 local_280 [128];
  undefined1 local_200 [128];
  undefined1 local_180 [368];
  
  bson_init(local_180);
  bson_init(local_280);
  cVar1 = bson_append_int32(local_280,"0",1,0);
  if (cVar1 == '\0') {
    pcVar4 = "bson_append_int32 (&cb, \"0\", 1, 0)";
    uVar3 = 500;
  }
  else {
    cVar1 = bson_append_int32(local_280,"1",1);
    if (cVar1 == '\0') {
      pcVar4 = "bson_append_int32 (&cb, \"1\", 1, 1)";
      uVar3 = 0x1f5;
    }
    else {
      cVar1 = bson_append_int32(local_280,"2",1,2);
      if (cVar1 == '\0') {
        pcVar4 = "bson_append_int32 (&cb, \"2\", 1, 2)";
        uVar3 = 0x1f6;
      }
      else {
        cVar1 = bson_append_array(local_180,"key",0xffffffffffffffff,local_280);
        if (cVar1 == '\0') {
          pcVar4 = "bson_append_array (&b, \"key\", -1, &cb)";
          uVar3 = 0x1f7;
        }
        else {
          cVar1 = bson_iter_init_find(local_200,local_180,"key");
          if (cVar1 == '\0') {
            pcVar4 = "bson_iter_init_find (&iter, &b, \"key\")";
            uVar3 = 0x1f8;
          }
          else {
            iVar2 = bson_iter_type(local_200);
            if (iVar2 == 4) {
              cVar1 = bson_iter_recurse(local_200,auStack_300);
              if (cVar1 == '\0') {
                pcVar4 = "bson_iter_recurse (&iter, &child)";
                uVar3 = 0x1fa;
              }
              else {
                cVar1 = bson_iter_find(auStack_300,"0");
                if (cVar1 == '\0') {
                  pcVar4 = "bson_iter_find (&child, \"0\")";
                  uVar3 = 0x1fb;
                }
                else {
                  cVar1 = bson_iter_find(auStack_300,"1");
                  if (cVar1 == '\0') {
                    pcVar4 = "bson_iter_find (&child, \"1\")";
                    uVar3 = 0x1fc;
                  }
                  else {
                    cVar1 = bson_iter_find(auStack_300,"2");
                    if (cVar1 == '\0') {
                      pcVar4 = "bson_iter_find (&child, \"2\")";
                      uVar3 = 0x1fd;
                    }
                    else {
                      cVar1 = bson_iter_next(auStack_300);
                      if (cVar1 == '\0') {
                        bson_destroy(local_180);
                        bson_destroy(local_280);
                        return;
                      }
                      pcVar4 = "!bson_iter_next (&child)";
                      uVar3 = 0x1fe;
                    }
                  }
                }
              }
            }
            else {
              pcVar4 = "BSON_ITER_HOLDS_ARRAY (&iter)";
              uVar3 = 0x1f9;
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
          uVar3,"test_bson_iter_recurse",pcVar4);
  abort();
}

Assistant:

static void
test_bson_iter_recurse (void)
{
   bson_iter_t iter;
   bson_iter_t child;
   bson_t b;
   bson_t cb;

   bson_init (&b);
   bson_init (&cb);
   BSON_ASSERT (bson_append_int32 (&cb, "0", 1, 0));
   BSON_ASSERT (bson_append_int32 (&cb, "1", 1, 1));
   BSON_ASSERT (bson_append_int32 (&cb, "2", 1, 2));
   BSON_ASSERT (bson_append_array (&b, "key", -1, &cb));
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_ARRAY (&iter));
   BSON_ASSERT (bson_iter_recurse (&iter, &child));
   BSON_ASSERT (bson_iter_find (&child, "0"));
   BSON_ASSERT (bson_iter_find (&child, "1"));
   BSON_ASSERT (bson_iter_find (&child, "2"));
   BSON_ASSERT (!bson_iter_next (&child));
   bson_destroy (&b);
   bson_destroy (&cb);
}